

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::changeRowBoundsInterface
          (Highs *this,HighsIndexCollection *index_collection,double *lower,double *upper)

{
  bool bVar1;
  undefined1 uVar2;
  HighsStatus HVar3;
  double *sorted_data1;
  double *data0;
  reference pvVar4;
  HighsOptions *in_RCX;
  HighsLogOptions *in_RDX;
  HighsIndexCollection *in_RSI;
  long in_RDI;
  HEkk *pHVar5;
  HighsInt iRow;
  double bound_scale_value;
  HighsLp *lp;
  HighsStatus return_status;
  vector<double,_std::allocator<double>_> local_rowUpper;
  vector<double,_std::allocator<double>_> local_rowLower;
  bool null_data;
  HighsInt num_row_bounds;
  HighsLogOptions *in_stack_fffffffffffffda8;
  vector<double,_std::allocator<double>_> *new_row_upper;
  Highs *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  LpAction in_stack_fffffffffffffdbc;
  HEkk *in_stack_fffffffffffffdc0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdc8;
  HEkk *pHVar6;
  HighsLogOptions *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  double *in_stack_fffffffffffffde8;
  allocator *paVar7;
  undefined4 in_stack_fffffffffffffdf0;
  HighsInt in_stack_fffffffffffffdf4;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdf8;
  HighsLogOptions *in_stack_fffffffffffffe00;
  undefined1 *infinite_bound;
  HighsLogOptions *upper_00;
  HighsIndexCollection *index_collection_00;
  Highs *this_00;
  undefined4 in_stack_fffffffffffffe48;
  undefined2 in_stack_fffffffffffffe4c;
  byte bVar8;
  HighsOptions *options;
  HighsInt num_entries;
  byte local_192;
  HighsLogOptions *sorted_data2;
  int local_16c;
  allocator local_151;
  string local_150 [128];
  HighsStatus local_d0;
  undefined1 local_c9;
  vector<double,_std::allocator<double>_> local_c8;
  undefined1 local_a9 [32];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [35];
  byte local_2d;
  HighsInt local_2c;
  HighsOptions *local_28;
  HighsLogOptions *local_20;
  undefined8 local_18;
  HighsStatus local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_2c = dataSize(in_RSI);
  if (local_2c < 1) {
    return kOk;
  }
  local_2d = 0;
  sorted_data1 = (double *)(in_RDI + 0xe28);
  sorted_data2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"row lower bounds",&local_51);
  bVar1 = doubleUserDataNotNull
                    (in_stack_fffffffffffffdd0,(double *)in_stack_fffffffffffffdc8,
                     (string *)in_stack_fffffffffffffdc0);
  local_192 = 1;
  if (!bVar1) {
    local_192 = local_2d;
  }
  local_2d = local_192 & 1;
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  data0 = (double *)(in_RDI + 0xe28);
  paVar7 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"row upper bounds",paVar7);
  num_entries = (HighsInt)((ulong)paVar7 >> 0x20);
  uVar2 = doubleUserDataNotNull
                    (in_stack_fffffffffffffdd0,(double *)in_stack_fffffffffffffdc8,
                     (string *)in_stack_fffffffffffffdc0);
  bVar8 = 1;
  if (!(bool)uVar2) {
    bVar8 = local_2d;
  }
  local_2d = bVar8 & 1;
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  if ((local_2d & 1) != 0) {
    return kError;
  }
  index_collection_00 = (HighsIndexCollection *)(&local_20->log_stream + local_2c);
  this_00 = (Highs *)local_a9;
  upper_00 = local_20;
  std::allocator<double>::allocator((allocator<double> *)0x4dc8b2);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),in_stack_fffffffffffffde8
             ,(double *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (allocator_type *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  std::allocator<double>::~allocator((allocator<double> *)0x4dc8e6);
  infinite_bound = &local_c9;
  std::allocator<double>::allocator((allocator<double> *)0x4dc919);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),in_stack_fffffffffffffde8
             ,(double *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (allocator_type *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  std::allocator<double>::~allocator((allocator<double> *)0x4dc947);
  options = local_28;
  if ((*(bool *)(local_18 + 0x10) & 1U) != 0) {
    in_stack_fffffffffffffdf4 = *(HighsInt *)(local_18 + 0x14);
    in_stack_fffffffffffffdf8 = (vector<int,_std::allocator<int>_> *)(local_18 + 0x18);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4dc998);
    in_stack_fffffffffffffda8 =
         (HighsLogOptions *)
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)0x4dc9aa);
    in_stack_fffffffffffffdb0 = (Highs *)0x0;
    sortSetData(num_entries,(vector<int,_std::allocator<int>_> *)local_28,data0,
                (double *)
                CONCAT17(uVar2,CONCAT16(bVar8,CONCAT24(in_stack_fffffffffffffe4c,
                                                       in_stack_fffffffffffffe48))),
                (double *)this_00,(double *)index_collection_00,sorted_data1,(double *)sorted_data2)
    ;
    in_stack_fffffffffffffe00 = local_20;
    options = local_28;
  }
  local_d0 = 0;
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  new_row_upper = (vector<double,_std::allocator<double>_> *)0x0;
  HVar3 = assessBounds(options,(char *)data0,
                       CONCAT13(uVar2,CONCAT12(bVar8,in_stack_fffffffffffffe4c)),
                       (HighsIndexCollection *)this_00,
                       (vector<double,_std::allocator<double>_> *)index_collection_00,
                       (vector<double,_std::allocator<double>_> *)upper_00,(double)infinite_bound,
                       (HighsVarType *)sorted_data1);
  paVar7 = &local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"assessBounds",paVar7);
  local_d0 = interpretCallStatus(in_stack_fffffffffffffe00,
                                 (HighsStatus)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                                 (HighsStatus)in_stack_fffffffffffffdf8,
                                 (string *)CONCAT44(in_stack_fffffffffffffdf4,HVar3));
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4dcb4c);
  uVar2 = (undefined1)((ulong)upper_00 >> 0x38);
  if (local_d0 == kError) {
    local_4 = local_d0;
  }
  else {
    if (*(int *)(in_RDI + 0x338) != 0) {
      bVar1 = boundScaleOk(in_stack_fffffffffffffdc8,
                           (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0,
                           in_stack_fffffffffffffdbc,(double)in_stack_fffffffffffffdb0);
      if (!bVar1) {
        highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                     "User bound scaling yields infinite bound\n");
        local_4 = kError;
        goto LAB_004dcdd7;
      }
      pHVar5 = (HEkk *)std::pow<int,int>(0,0x4dcca9);
      for (local_16c = 0; uVar2 = (undefined1)((ulong)upper_00 >> 0x38), local_16c < local_2c;
          local_16c = local_16c + 1) {
        in_stack_fffffffffffffdc0 = pHVar5;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_a9 + 1),
                            (long)local_16c);
        *pvVar4 = (double)in_stack_fffffffffffffdc0 * *pvVar4;
        pHVar6 = pHVar5;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,(long)local_16c)
        ;
        *pvVar4 = (double)pHVar6 * *pvVar4;
      }
    }
    changeLpRowBounds((HighsLp *)in_stack_fffffffffffffdc0,
                      (HighsIndexCollection *)
                      CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                      (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0,
                      new_row_upper);
    setNonbasicStatusInterface(this_00,index_collection_00,(bool)uVar2);
    invalidateModelStatusSolutionAndInfo(in_stack_fffffffffffffdb0);
    HEkk::updateStatus(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
    local_4 = kOk;
  }
LAB_004dcdd7:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0);
  return local_4;
}

Assistant:

HighsStatus Highs::changeRowBoundsInterface(
    HighsIndexCollection& index_collection, const double* lower,
    const double* upper) {
  HighsInt num_row_bounds = dataSize(index_collection);
  // If a non-positive number of costs (may) need changing nothing needs to be
  // done
  if (num_row_bounds <= 0) return HighsStatus::kOk;
  bool null_data = false;
  null_data =
      doubleUserDataNotNull(options_.log_options, lower, "row lower bounds") ||
      null_data;
  null_data =
      doubleUserDataNotNull(options_.log_options, upper, "row upper bounds") ||
      null_data;
  if (null_data) return HighsStatus::kError;
  // Take a copy of the cost that can be normalised
  std::vector<double> local_rowLower{lower, lower + num_row_bounds};
  std::vector<double> local_rowUpper{upper, upper + num_row_bounds};
  // If changing the bounds for a set of rows, ensure that the
  // set and data are in ascending order
  if (index_collection.is_set_)
    sortSetData(index_collection.set_num_entries_, index_collection.set_, lower,
                upper, NULL, local_rowLower.data(), local_rowUpper.data(),
                NULL);
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(
      options_.log_options,
      assessBounds(options_, "row", 0, index_collection, local_rowLower,
                   local_rowUpper, options_.infinite_bound),
      return_status, "assessBounds");
  if (return_status == HighsStatus::kError) return return_status;
  HighsLp& lp = model_.lp_;
  if (lp.user_bound_scale_) {
    // Assess and apply any user bound scaling
    if (!boundScaleOk(local_rowLower, local_rowUpper, lp.user_bound_scale_,
                      options_.infinite_bound)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User bound scaling yields infinite bound\n");
      return HighsStatus::kError;
    }
    double bound_scale_value = std::pow(2, lp.user_bound_scale_);
    for (HighsInt iRow = 0; iRow < num_row_bounds; iRow++) {
      local_rowLower[iRow] *= bound_scale_value;
      local_rowUpper[iRow] *= bound_scale_value;
    }
  }

  changeLpRowBounds(lp, index_collection, local_rowLower, local_rowUpper);
  // Update HiGHS basis status and (any) simplex move status of
  // nonbasic variables whose bounds have changed
  setNonbasicStatusInterface(index_collection, false);
  // Deduce the consequences of new row bounds
  invalidateModelStatusSolutionAndInfo();
  // Determine any implications for simplex data
  ekk_instance_.updateStatus(LpAction::kNewBounds);
  return HighsStatus::kOk;
}